

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitIO.cpp
# Opt level: O0

ssize_t __thiscall BitInStream::read(BitInStream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  Parameters<unsigned_char,_(unsigned_short)8> *parameters;
  int temp_1;
  uchar temp;
  value_type_conflict *in_stack_ffffffffffffffc8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((this->cByte == -1) || ((this->streamDone & 1U) != 0)) {
    uVar2 = endStream((BitInStream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else {
    if (this->remBits == 0) {
      if (((this->sync == 0) || (this->bCount % this->sync != 0)) || ((this->flag & 1U) != 0)) {
        iVar3 = std::istream::get();
        if (iVar3 == -1) {
          uVar2 = endStream((BitInStream *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
          goto LAB_00160f89;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        this->cByte = iVar3;
        this->remBits = 8;
        this->bCount = this->bCount + 1;
        this->flag = false;
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x160e8f);
        parameters = (Parameters<unsigned_char,_(unsigned_short)8> *)
                     std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               (&this->crcBuffer);
        CRC::CRC_8_LTE();
        bVar1 = CRC::Calculate<unsigned_char,(unsigned_short)8>
                          ((void *)CONCAT17(in_stack_ffffffffffffffe7,
                                            CONCAT16(in_stack_ffffffffffffffe6,
                                                     in_stack_ffffffffffffffe0)),(size_t)this,
                           parameters);
        this->cByte = (uint)bVar1;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x160eda);
        this->remBits = 8;
        this->flag = true;
      }
    }
    this->remBits = this->remBits + -1;
    uVar2 = this->cByte >> ((byte)this->remBits & 0x1f) & 1;
  }
LAB_00160f89:
  return (ulong)uVar2;
}

Assistant:

int BitInStream::read() {
    if (cByte == -1 || streamDone) {
        return endStream();
    }
    if (!remBits) {
        if (sync != 0 && (bCount % sync == 0) && !flag) {
            unsigned char temp = CRC::Calculate(crcBuffer.data(), crcBuffer.size() * sizeof(char), CRC::CRC_8_LTE());
            cByte = temp;
            crcBuffer.clear();
            remBits = 8;
            flag = true;
        } else {
            int temp = in.get();
            if (temp == -1) {
                return endStream();
            } else {
                crcBuffer.push_back(static_cast<unsigned char>(temp));
                inpBuffer.push_back(static_cast<unsigned char>(temp));
            }
            cByte = temp;
            remBits = 8;
            bCount++;
            flag = false;
        }
    }
    //assert remBits > 0
    remBits--;
    return (cByte >> remBits) & 1;
}